

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O3

void __thiscall
TPZMatrix<float>::MultAdd
          (TPZMatrix<float> *this,TPZFMatrix<float> *x,TPZFMatrix<float> *y,TPZFMatrix<float> *z,
          float alpha,float beta,int opt)

{
  float fVar1;
  long lVar2;
  int64_t iVar3;
  TPZFMatrix<float> *pTVar4;
  TPZFMatrix<float> *pTVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  float extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  float extraout_XMM0_Da_01;
  float extraout_XMM0_Da_02;
  float val;
  float local_74;
  int local_70;
  float local_6c;
  int64_t local_68;
  int64_t local_60;
  float local_58;
  float local_54;
  TPZFMatrix<float> *local_50;
  TPZFMatrix<float> *local_48;
  long local_40;
  long local_38;
  
  local_70 = opt;
  local_6c = alpha;
  if (opt == 0) {
    lVar7 = (this->super_TPZBaseMatrix).fCol;
    if (lVar7 == (x->super_TPZMatrix<float>).super_TPZBaseMatrix.fRow) goto LAB_00c698d6;
  }
  else {
    lVar7 = (x->super_TPZMatrix<float>).super_TPZBaseMatrix.fRow;
LAB_00c698d6:
    if ((this->super_TPZBaseMatrix).fRow == lVar7) goto LAB_00c698eb;
  }
  Error("Operator* <matrices with incompatible dimensions>",(char *)0x0);
LAB_00c698eb:
  local_38 = (x->super_TPZMatrix<float>).super_TPZBaseMatrix.fCol;
  if ((local_38 != (y->super_TPZMatrix<float>).super_TPZBaseMatrix.fCol) ||
     ((x->super_TPZMatrix<float>).super_TPZBaseMatrix.fRow !=
      (y->super_TPZMatrix<float>).super_TPZBaseMatrix.fRow)) {
    Error("TPZFMatrix::MultiplyAdd incompatible dimensions\n",(char *)0x0);
    local_38 = (x->super_TPZMatrix<float>).super_TPZBaseMatrix.fCol;
  }
  local_68 = (this->super_TPZBaseMatrix).fRow;
  local_60 = (this->super_TPZBaseMatrix).fCol;
  local_50 = x;
  local_48 = z;
  PrepareZ(this,y,z,beta,local_70);
  local_74 = 0.0;
  if (0 < local_38) {
    local_40 = 0;
    lVar7 = 0;
    do {
      if (local_70 == 0) {
        if (0 < local_60) {
          lVar6 = 0;
          do {
            pTVar5 = local_48;
            pTVar4 = local_50;
            if (0 < local_68) {
              lVar8 = 0;
              do {
                lVar2 = (pTVar5->super_TPZMatrix<float>).super_TPZBaseMatrix.fRow;
                if ((lVar2 <= lVar8) ||
                   ((pTVar5->super_TPZMatrix<float>).super_TPZBaseMatrix.fCol <= lVar7)) {
                  TPZFMatrix<float>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                  pzinternal::DebugStopImpl
                            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                             ,0x26d);
                }
                fVar1 = *(float *)((long)pTVar5->fElem + lVar8 * 4 + lVar2 * local_40);
                (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                          (this,lVar8,lVar6);
                local_58 = extraout_XMM0_Da_01 * local_6c;
                (*(pTVar4->super_TPZMatrix<float>).super_TPZBaseMatrix.super_TPZSavable.
                  _vptr_TPZSavable[0x24])(pTVar4,lVar6,lVar7);
                local_74 = extraout_XMM0_Da_02 * local_58 + fVar1;
                (*(pTVar5->super_TPZMatrix<float>).super_TPZBaseMatrix.super_TPZSavable.
                  _vptr_TPZSavable[0x23])(pTVar5,lVar8,lVar7,&local_74);
                lVar8 = lVar8 + 1;
              } while (local_68 != lVar8);
            }
            lVar6 = lVar6 + 1;
          } while (lVar6 != local_60);
        }
      }
      else if (0 < local_68) {
        lVar6 = 0;
        do {
          pTVar4 = local_50;
          iVar3 = local_60;
          local_74 = 0.0;
          if (0 < local_60) {
            lVar8 = 0;
            do {
              (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                        (this,lVar8,lVar6);
              (*(pTVar4->super_TPZMatrix<float>).super_TPZBaseMatrix.super_TPZSavable.
                _vptr_TPZSavable[0x24])(pTVar4,lVar8,lVar7);
              local_74 = extraout_XMM0_Da_00 * extraout_XMM0_Da + local_74;
              lVar8 = lVar8 + 1;
            } while (iVar3 != lVar8);
          }
          local_54 = local_74 * local_6c;
          (*(local_48->super_TPZMatrix<float>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
            [0x23])(local_48,lVar6,lVar7,&local_54);
          lVar6 = lVar6 + 1;
        } while (lVar6 != local_68);
      }
      lVar7 = lVar7 + 1;
      local_40 = local_40 + 4;
    } while (lVar7 != local_38);
  }
  return;
}

Assistant:

void TPZMatrix<TVar>::MultAdd(const TPZFMatrix<TVar> &x,const TPZFMatrix<TVar> &y, TPZFMatrix<TVar> &z, const TVar alpha,const TVar beta,const int opt) const {
	if ((!opt && Cols() != x.Rows()) || Rows() != x.Rows())
		Error( "Operator* <matrices with incompatible dimensions>" );
	if(x.Cols() != y.Cols() || x.Rows() != y.Rows()) {
		Error ("TPZFMatrix::MultiplyAdd incompatible dimensions\n");
	}
	int64_t rows = Rows();
	int64_t cols = Cols();
	int64_t xcols = x.Cols();
	int64_t ic, c, r;
	PrepareZ(y,z,beta,opt);
	TVar val = 0.;
	for (ic = 0; ic < xcols; ic++) {
		if(!opt) {
			for ( c = 0; c<cols; c++) {
				for ( r = 0; r < rows; r++ ) {
					val = z(r,ic) + alpha * GetVal(r,c) * x.GetVal(c,ic);
					z.PutVal(r,ic,val);
				}
			}
		} else {
			for (r = 0; r<rows; r++) {
            	val = 0.;
				for(c = 0; c<cols; c++) {
					val += GetVal(c,r)* x.GetVal(c,ic);
				}
				z.PutVal(r,ic,alpha*val);
			}
		}
	}
}